

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeName::ParseNodeName
          (ParseNodeName *this,charcount_t ichMin,charcount_t ichLim,IdentPtr name)

{
  IdentPtr name_local;
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  ParseNodeName *this_local;
  
  ParseNode::ParseNode(&this->super_ParseNode,knopName,ichMin,ichLim);
  this->pid = name;
  this->sym = (Symbol *)0x0;
  this->symRef = (Symbol **)0x0;
  this->isSpecialName = false;
  return;
}

Assistant:

ParseNodeName::ParseNodeName(charcount_t ichMin, charcount_t ichLim, IdentPtr name)
    : ParseNode(knopName, ichMin, ichLim), pid(name)
{     
    this->sym = nullptr;    
    this->symRef = nullptr;
    this->isSpecialName = false;
}